

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflectionTest_SetAllocatedExtensionMessageOnArenaTest_Test::TestBody
          (GeneratedMessageReflectionTest_SetAllocatedExtensionMessageOnArenaTest_Test *this)

{
  Message *message;
  Descriptor *base_descriptor;
  TestAllExtensions from_message2;
  TestAllExtensions from_message1;
  ReflectionTester reflection_tester;
  Arena arena;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  message = (Message *)
            Arena::DefaultConstruct<proto2_unittest::TestAllExtensions>((Arena *)&arena.impl_);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&from_message1);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&from_message2);
  base_descriptor = proto2_unittest::TestAllExtensions::GetDescriptor();
  TestUtil::ReflectionTester::ReflectionTester(&reflection_tester,base_descriptor);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            (&reflection_tester,&from_message1.super_Message);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            (&reflection_tester,&from_message2.super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,message,IS_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            (&from_message1.super_Message,message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            (&from_message2.super_Message,message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToNullViaReflection
            (&reflection_tester,message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&reflection_tester,message,IS_NULL);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&from_message2);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&from_message1);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, SetAllocatedExtensionMessageOnArenaTest) {
  Arena arena;
  unittest::TestAllExtensions* to_message =
      Arena::Create<unittest::TestAllExtensions>(&arena);
  unittest::TestAllExtensions from_message1;
  unittest::TestAllExtensions from_message2;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllExtensions::descriptor());
  reflection_tester.SetAllFieldsViaReflection(&from_message1);
  reflection_tester.SetAllFieldsViaReflection(&from_message2);

  // Before moving fields, we expect the nested messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are moved we should get non-nullptr releases.
  reflection_tester.SetAllocatedOptionalMessageFieldsToMessageViaReflection(
      &from_message1, to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::NOT_NULL);

  // Another move to make sure that we can SetAllocated several times.
  reflection_tester.SetAllocatedOptionalMessageFieldsToMessageViaReflection(
      &from_message2, to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::NOT_NULL);

  // After SetAllocatedOptionalMessageFieldsToNullViaReflection() we expect the
  // releases to be nullptr again.
  reflection_tester.SetAllocatedOptionalMessageFieldsToNullViaReflection(
      to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::IS_NULL);
}